

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall
embree::ImageT<embree::Col3<float>_>::ImageT
          (ImageT<embree::Col3<float>_> *this,size_t width,size_t height,Col3<float> *color,
          bool copy,string *name,bool flip_y)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  Col3<float> *pCVar3;
  float *pfVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  undefined7 in_register_00000081;
  size_t sVar8;
  ulong uVar9;
  
  (this->super_Image).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Image).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Image_002ccc00;
  (this->super_Image).width = width;
  (this->super_Image).height = height;
  (this->super_Image).name._M_dataplus._M_p = (pointer)&(this->super_Image).name.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Image).name,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_Image).super_RefCount._vptr_RefCount = (_func_int **)&PTR__ImageT_002ce228;
  if ((int)CONCAT71(in_register_00000081,copy) == 0) {
    this->data = color;
  }
  else {
    uVar9 = height * width;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar9;
    uVar6 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
      uVar6 = SUB168(auVar2 * ZEXT816(0xc),0);
    }
    pCVar3 = (Col3<float> *)operator_new__(uVar6);
    this->data = pCVar3;
    if (flip_y) {
      if (height != 0) {
        pfVar4 = (float *)((long)&color->r + (height - 1) * width * 0xc);
        sVar5 = 0;
        do {
          if (width != 0) {
            lVar7 = 8;
            sVar8 = width;
            do {
              *(undefined8 *)((long)pCVar3 + lVar7 + -8) =
                   *(undefined8 *)((long)pfVar4 + lVar7 + -8);
              *(undefined4 *)((long)&pCVar3->r + lVar7) = *(undefined4 *)((long)pfVar4 + lVar7);
              lVar7 = lVar7 + 0xc;
              sVar8 = sVar8 - 1;
            } while (sVar8 != 0);
          }
          sVar5 = sVar5 + 1;
          pCVar3 = pCVar3 + width;
          pfVar4 = pfVar4 + width * -3;
        } while (sVar5 != height);
      }
    }
    else if (uVar9 != 0) {
      lVar7 = 8;
      do {
        pCVar3 = this->data;
        *(undefined4 *)((long)pCVar3 + lVar7 + -8) = *(undefined4 *)((long)color + lVar7 + -8);
        *(undefined4 *)((long)pCVar3 + lVar7 + -4) = *(undefined4 *)((long)color + lVar7 + -4);
        *(undefined4 *)((long)&pCVar3->r + lVar7) = *(undefined4 *)((long)&color->r + lVar7);
        lVar7 = lVar7 + 0xc;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  return;
}

Assistant:

ImageT (size_t width, size_t height, T* color, const bool copy = true, const std::string& name = "", const bool flip_y = false)
      : Image(width,height,name)
    {
      if (copy)
      {
        data = new T[width*height];

        if (flip_y)
        {
          const T* in = color + (height-1) * width;
          T* out = data;

          for (size_t y=0; y<height; y++)
          {
            for (size_t x=0; x<width; x++)
              out[x] = in[x];

            in -= width;
            out += width;
          }
        }
        else
        {
          for (size_t i=0; i<width*height; i++)
            data[i] = color[i];
        }
      } 
      else
      {
        data = color;
      }
    }